

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,UniformType *param_1)

{
  bool bVar1;
  UniformType *param_1_local;
  UniformType *this_local;
  
  this->enumType = param_1->enumType;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->arraySizesSegmented,&param_1->arraySizesSegmented);
  this->arraySize = param_1->arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,&param_1->childTypes);
  std::__cxx11::string::string((string *)&this->strType,(string *)&param_1->strType);
  std::__cxx11::string::string((string *)&this->refStrType,(string *)&param_1->refStrType);
  this->size = param_1->size;
  this->baseType = param_1->baseType;
  bVar1 = param_1->signedType;
  this->isArray = param_1->isArray;
  this->signedType = bVar1;
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}